

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_format(jit_State *J,RecordFFData *rd,TRef hdr,int sbufx)

{
  TRef TVar1;
  TRef TVar2;
  SFormat k;
  uint tr;
  GCobj *pGVar3;
  IRRef1 IVar4;
  IRCallID id;
  IRRef1 IVar5;
  FormatState fs;
  ulong local_60;
  FormatState local_50;
  
  local_60 = (ulong)(uint)sbufx;
  TVar1 = lj_ir_tostr(J,J->base[local_60]);
  pGVar3 = (GCobj *)argv2str(J,rd->argv + local_60);
  TVar2 = lj_ir_kgc(J,pGVar3,IRT_STR);
  (J->fold).ins.field_0.ot = 0x884;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  lj_opt_fold(J);
  local_50.p = (uint8_t *)&(pGVar3->gch).gclist;
  local_50.e = (uint8_t *)((long)pGVar3 + (ulong)(pGVar3->str).len + 0x18);
  TVar1 = hdr;
LAB_00158c6a:
  while( true ) {
    k = lj_strfmt_parse(&local_50);
    IVar4 = (IRRef1)TVar1;
    if (k != 2) break;
    lj_ir_kint(J,2);
LAB_00158cde:
    pGVar3 = (GCobj *)lj_str_new(J->L,local_50.str,(ulong)local_50.len);
    TVar1 = lj_ir_kgc(J,pGVar3,IRT_STR);
    (J->fold).ins.field_0.ot = 0x5689;
    (J->fold).ins.field_0.op1 = IVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    TVar1 = lj_opt_fold(J);
  }
  if (k == 0) {
    if (sbufx != 0) {
      (J->fold).ins.field_0.op1 = IVar4;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x12000000;
      lj_opt_fold(J);
      return;
    }
    (J->fold).ins.field_0.ot = 0x5784;
    (J->fold).ins.field_0.op1 = IVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)hdr;
    TVar1 = lj_opt_fold(J);
    *J->base = TVar1;
    return;
  }
  tr = J->base[local_60 + 1];
  TVar2 = lj_ir_kint(J,k);
  if (5 < (k & 0xf) - 2) {
LAB_00158f00:
    recff_nyi(J,rd);
    return;
  }
  local_60 = local_60 + 1;
  IVar5 = (IRRef1)tr;
  switch(k & 0xf) {
  case 2:
    goto LAB_00158cde;
  case 3:
    id = IRCALL_lj_strfmt_putfnum_int;
    break;
  case 4:
    id = IRCALL_lj_strfmt_putfnum_uint;
    break;
  case 5:
    id = IRCALL_lj_strfmt_putfnum;
    goto LAB_00158ddb;
  case 6:
    if ((tr & 0x1f000000) != 0x4000000) goto LAB_00158f00;
    if (k == 6) {
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = IVar5;
      goto LAB_00158e30;
    }
    if ((k & 0x10) == 0) {
      id = IRCALL_lj_strfmt_putfstr;
      goto LAB_00158e6e;
    }
    TVar1 = lj_ir_call(J,IRCALL_lj_strfmt_putquoted,(ulong)TVar1,(ulong)tr);
    goto LAB_00158c6a;
  case 7:
    tr = lj_opt_narrow_toint(J,tr);
    if (k == 7) {
      (J->fold).ins.field_0.op1 = (IRRef1)tr;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5d040002;
      goto LAB_00158e10;
    }
    id = IRCALL_lj_strfmt_putfchar;
    goto LAB_00158e6e;
  }
  if ((tr >> 0x18 & 0x1f) - 0xf < 5) {
    if (k == 3) {
      (J->fold).ins.field_0.op1 = IVar5;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5d040000;
LAB_00158e10:
      TVar1 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
LAB_00158e30:
      TVar1 = lj_opt_fold(J);
      goto LAB_00158c6a;
    }
    (J->fold).ins.field_0.op1 = IVar5;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b160ad3;
    tr = lj_opt_fold(J);
LAB_00158e54:
    id = IRCALL_lj_strfmt_putfxint;
  }
  else {
    if ((tr & 0x1f000000) == 0xa000000) {
      tr = lj_crecord_loadiu64(J,tr,rd->argv + local_60);
      goto LAB_00158e54;
    }
LAB_00158ddb:
    tr = lj_ir_tonum(J,tr);
  }
LAB_00158e6e:
  TVar1 = lj_ir_call(J,id,(ulong)TVar1,(ulong)TVar2,(ulong)tr);
  goto LAB_00158c6a;
}

Assistant:

static void recff_format(jit_State *J, RecordFFData *rd, TRef hdr, int sbufx)
{
  ptrdiff_t arg = sbufx;
  TRef tr = hdr, trfmt = lj_ir_tostr(J, J->base[arg]);
  GCstr *fmt = argv2str(J, &rd->argv[arg]);
  FormatState fs;
  SFormat sf;
  /* Specialize to the format string. */
  emitir(IRTG(IR_EQ, IRT_STR), trfmt, lj_ir_kstr(J, fmt));
  lj_strfmt_init(&fs, strdata(fmt), fmt->len);
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {  /* Parse format. */
    TRef tra = sf == STRFMT_LIT ? 0 : J->base[++arg];
    TRef trsf = lj_ir_kint(J, (int32_t)sf);
    IRCallID id;
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr,
		  lj_ir_kstr(J, lj_str_new(J->L, fs.str, fs.len)));
      break;
    case STRFMT_INT:
      id = IRCALL_lj_strfmt_putfnum_int;
    handle_int:
      if (!tref_isinteger(tra)) {
#if LJ_HASFFI
	if (tref_iscdata(tra)) {
	  tra = lj_crecord_loadiu64(J, tra, &rd->argv[arg]);
	  tr = lj_ir_call(J, IRCALL_lj_strfmt_putfxint, tr, trsf, tra);
	  break;
	}
#endif
	goto handle_num;
      }
      if (sf == STRFMT_INT) { /* Shortcut for plain %d. */
	tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_INT));
      } else {
#if LJ_HASFFI
	tra = emitir(IRT(IR_CONV, IRT_U64), tra,
		     (IRT_INT|(IRT_U64<<5)|IRCONV_SEXT));
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfxint, tr, trsf, tra);
	lj_needsplit(J);
#else
	recff_nyiu(J, rd);  /* Don't bother working around this NYI. */
	return;
#endif
      }
      break;
    case STRFMT_UINT:
      id = IRCALL_lj_strfmt_putfnum_uint;
      goto handle_int;
    case STRFMT_NUM:
      id = IRCALL_lj_strfmt_putfnum;
    handle_num:
      tra = lj_ir_tonum(J, tra);
      tr = lj_ir_call(J, id, tr, trsf, tra);
      if (LJ_SOFTFP32) lj_needsplit(J);
      break;
    case STRFMT_STR:
      if (!tref_isstr(tra)) {
	recff_nyiu(J, rd);  /* NYI: __tostring and non-string types for %s. */
	/* NYI: also buffers. */
	return;
      }
      if (sf == STRFMT_STR)  /* Shortcut for plain %s. */
	tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, tra);
      else if ((sf & STRFMT_T_QUOTED))
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putquoted, tr, tra);
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfstr, tr, trsf, tra);
      break;
    case STRFMT_CHAR:
      tra = lj_opt_narrow_toint(J, tra);
      if (sf == STRFMT_CHAR)  /* Shortcut for plain %c. */
	tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_CHAR));
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfchar, tr, trsf, tra);
      break;
    case STRFMT_PTR:  /* NYI */
    case STRFMT_ERR:
    default:
      recff_nyiu(J, rd);
      return;
    }
  }
  if (sbufx) {
    emitir(IRT(IR_USE, IRT_NIL), tr, 0);
  } else {
    J->base[0] = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
  }
}